

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_XY_20(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  undefined1 *__src;
  pel first_line [192];
  undefined8 uStack_f0;
  undefined1 local_e8 [192];
  
  iVar4 = iHeight * 2 + -1;
  uVar5 = (iWidth + iHeight * 2) - 2;
  pbVar7 = pSrc + -(long)iHeight;
  if (iVar4 < 1) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = (uint)*pbVar7;
    do {
      pbVar1 = pbVar7 + -1;
      bVar2 = pbVar7[1];
      bVar3 = pbVar7[2];
      pbVar7 = pbVar7 + 1;
      local_e8[uVar6] = (char)((uint)*pbVar1 + (uint)bVar3 + (bVar2 + uVar8) * 3 + 4 >> 3);
      local_e8[uVar6 + 1] = (char)(uVar8 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
      uVar6 = uVar6 + 2;
      uVar8 = (uint)bVar2;
    } while ((long)uVar6 < (long)iVar4);
  }
  if ((int)uVar6 <= (int)uVar5) {
    lVar9 = -1;
    do {
      local_e8[lVar9 + (uVar6 & 0xffffffff)] =
           (char)((uint)pbVar7[lVar9] + (uint)pbVar7[lVar9 + 1] * 2 + (uint)pbVar7[lVar9 + 2] + 2 >>
                 2);
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar5 - (uVar6 & 0xffffffff) != lVar9);
  }
  if (0 < iHeight) {
    __src = local_e8 + (long)iVar4 + -1;
    do {
      uStack_f0 = 0x11f4a0;
      memcpy(dst,__src,(long)iWidth);
      __src = __src + -2;
      dst = dst + i_dst;
      iHeight = iHeight + -1;
    } while (iHeight != 0);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_20(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[64 + 128]);
    int left_size = (iHeight - 1) * 2 + 1;
    int top_size = iWidth - 1;
    int line_size = left_size + top_size;
    int i;
    pel *pfirst = first_line + left_size - 1;

    pSrc -= iHeight;

    for (i = 0; i < left_size; i += 2, pSrc++) {
        first_line[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        first_line[i + 1] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
    }
    i--;

    for (; i < line_size; i++, pSrc++) {
        first_line[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst, iWidth * sizeof(pel));
        pfirst -= 2;
        dst += i_dst;
    }
}